

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O3

void __thiscall
soplex::DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
          (DataArray<soplex::SPxSolverBase<double>::VarStatus> *this,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *old)

{
  int n;
  
  this->thesize = old->thesize;
  n = old->themax;
  this->themax = n;
  this->data = (VarStatus *)0x0;
  this->memFactor = old->memFactor;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(&this->data,n);
  if ((ulong)(uint)this->thesize != 0) {
    memcpy(this->data,old->data,(ulong)(uint)this->thesize << 2);
    return;
  }
  return;
}

Assistant:

DataArray(const DataArray& old)
      : thesize(old.thesize)
      , themax(old.themax)
      , data(nullptr)
      , memFactor(old.memFactor)
   {
      spx_alloc(data, max());

      assert(thesize >= 0);

      if(thesize)
         memcpy(data, old.data, (unsigned int)thesize * sizeof(T));

      assert(isConsistent());
   }